

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O1

void processIncludeDirectories
               (cmTarget *tgt,
               vector<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
               *entries,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *includes,
               hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
               *uniqueIncludes,cmGeneratorExpressionDAGChecker *dagChecker,string *config,
               bool debugIncludes,string *language)

{
  bool bVar1;
  cmTarget *pcVar2;
  cmMakefile *pcVar3;
  pointer pcVar4;
  cmCompiledGeneratorExpression *__x;
  PolicyStatus PVar5;
  char *pcVar6;
  ostream *poVar7;
  long *plVar8;
  cmake *this;
  size_type *psVar9;
  long *plVar10;
  PolicyID id;
  PolicyID id_00;
  MessageType MVar11;
  char cVar12;
  hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
  *this_00;
  pointer path;
  bool bVar13;
  string usedIncludes;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  entryIncludes;
  string inc;
  string local_2b8;
  cmTarget *local_298;
  cmLinkImplItem *local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  undefined1 *local_268;
  long local_260;
  undefined1 local_258;
  undefined7 uStack_257;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_248;
  cmMakefile *local_228;
  pointer local_220;
  PolicyMap *local_218;
  hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
  *local_210;
  long *local_208;
  long local_200;
  long local_1f8;
  long lStack_1f0;
  long *local_1e8 [2];
  long local_1d8 [2];
  pointer local_1c8;
  cmGeneratorExpressionDAGChecker *local_1c0;
  string *local_1b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_1b0;
  undefined1 local_1a8 [16];
  cmListFileContext local_198;
  ios_base local_138 [264];
  
  local_220 = (entries->
              super__Vector_base<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
              )._M_impl.super__Vector_impl_data._M_start;
  local_1c8 = (entries->
              super__Vector_base<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
              )._M_impl.super__Vector_impl_data._M_finish;
  if (local_220 != local_1c8) {
    local_228 = tgt->Makefile;
    local_218 = &tgt->PolicyMap;
    local_298 = tgt;
    local_210 = &uniqueIncludes->_M_ht;
    local_1c0 = dagChecker;
    local_1b8 = config;
    local_1b0 = includes;
    do {
      local_290 = (*local_220)->LinkImplItem;
      pcVar2 = (local_290->super_cmLinkItem).Target;
      if (pcVar2 == (cmTarget *)0x0) {
        cVar12 = '\0';
      }
      else {
        cVar12 = pcVar2->IsImportedTarget;
      }
      bVar1 = local_290->FromGenex;
      local_248.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
      local_248.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
      local_248.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pcVar6 = cmCompiledGeneratorExpression::Evaluate
                         (((*local_220)->ge).x_,local_228,local_1b8,false,local_298,local_1c0,
                          language);
      std::__cxx11::string::string((string *)local_1a8,pcVar6,(allocator *)&local_268);
      cmSystemTools::ExpandListArgument((string *)local_1a8,&local_248,false);
      if ((cmListFileContext *)local_1a8._0_8_ != &local_198) {
        operator_delete((void *)local_1a8._0_8_,(ulong)(local_198.Name._M_dataplus._M_p + 1));
      }
      local_268 = &local_258;
      local_260 = 0;
      local_258 = 0;
      for (path = local_248.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; this_00 = local_210,
          bVar13 = path == local_248.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish, !bVar13; path = path + 1) {
        if ((cVar12 != '\0') &&
           (bVar13 = cmsys::SystemTools::FileExists((path->_M_dataplus)._M_p), !bVar13)) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          MVar11 = FATAL_ERROR;
          if (bVar1 != false) {
            PVar5 = cmPolicies::PolicyMap::Get(local_218,CMP0027);
            if (PVar5 != OLD) {
              if (PVar5 != WARN) goto LAB_003abe3b;
              cmPolicies::GetPolicyWarning_abi_cxx11_(&local_2b8,(cmPolicies *)0x1b,id_00);
              poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)local_1a8,local_2b8._M_dataplus._M_p,
                                  local_2b8._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
                operator_delete(local_2b8._M_dataplus._M_p,
                                local_2b8.field_2._M_allocated_capacity + 1);
              }
            }
            MVar11 = AUTHOR_WARNING;
          }
LAB_003abe3b:
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"Imported target \"",0x11);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1a8,
                              (local_290->super_cmLinkItem).super_string._M_dataplus._M_p,
                              (local_290->super_cmLinkItem).super_string._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar7,"\" includes non-existent path\n  \"",0x20);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar7,(path->_M_dataplus)._M_p,path->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar7,
                     "\"\nin its INTERFACE_INCLUDE_DIRECTORIES. Possible reasons include:\n* The path was deleted, renamed, or moved to another location.\n* An install or uninstall procedure did not complete successfully.\n* The installation package was faulty and references files it does not provide.\n"
                     ,0x114);
          pcVar3 = local_298->Makefile;
          std::__cxx11::stringbuf::str();
          cmMakefile::IssueMessage(pcVar3,MVar11,&local_2b8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
            operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
          }
LAB_003abeeb:
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base(local_138);
          if (local_268 != &local_258) {
            operator_delete(local_268,CONCAT71(uStack_257,local_258) + 1);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_248);
          return;
        }
        bVar13 = cmsys::SystemTools::FileIsFullPath((path->_M_dataplus)._M_p);
        if (!bVar13) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          if ((local_290->super_cmLinkItem).super_string._M_string_length == 0) {
            PVar5 = cmPolicies::PolicyMap::Get(local_218,CMP0021);
            MVar11 = FATAL_ERROR;
            if (PVar5 == OLD) {
              bVar13 = true;
            }
            else if (PVar5 == WARN) {
              cmPolicies::GetPolicyWarning_abi_cxx11_(&local_2b8,(cmPolicies *)0x15,id);
              poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)local_1a8,local_2b8._M_dataplus._M_p,
                                  local_2b8._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
                operator_delete(local_2b8._M_dataplus._M_p,
                                local_2b8.field_2._M_allocated_capacity + 1);
              }
              bVar13 = false;
              MVar11 = AUTHOR_WARNING;
            }
            else {
              bVar13 = false;
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,
                       "Found relative path while evaluating include directories of \"",0x3d);
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_1a8,(local_298->Name)._M_dataplus._M_p,
                                (local_298->Name)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\":\n  \"",6);
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar7,(path->_M_dataplus)._M_p,path->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\"\n",2);
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Target \"",8);
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_1a8,
                                (local_290->super_cmLinkItem).super_string._M_dataplus._M_p,
                                (local_290->super_cmLinkItem).super_string._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar7,
                       "\" contains relative path in its INTERFACE_INCLUDE_DIRECTORIES:\n  \"",0x42)
            ;
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar7,(path->_M_dataplus)._M_p,path->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\"",1);
            MVar11 = FATAL_ERROR;
            bVar13 = false;
          }
          if (!bVar13) {
            pcVar3 = local_298->Makefile;
            std::__cxx11::stringbuf::str();
            cmMakefile::IssueMessage(pcVar3,MVar11,&local_2b8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
              operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1
                             );
            }
            if (MVar11 != AUTHOR_WARNING) goto LAB_003abeeb;
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base(local_138);
          this_00 = local_210;
        }
        bVar13 = cmSystemTools::IsOff((path->_M_dataplus)._M_p);
        if (!bVar13) {
          cmsys::SystemTools::ConvertToUnixSlashes(path);
        }
        local_1a8._0_8_ = &local_198;
        pcVar4 = (path->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_1a8,pcVar4,pcVar4 + path->_M_string_length);
        cmsys::
        hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
        ::resize(this_00,this_00->_M_num_elements + 1);
        cmsys::
        hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
        ::insert_unique_noresize
                  ((pair<cmsys::_Hashtable_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>,_bool>
                    *)&local_2b8,this_00,(value_type *)local_1a8);
        if ((local_2b8.field_2._M_local_buf[0] == '\x01') &&
           (std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(local_1b0,(value_type *)local_1a8), debugIncludes)) {
          std::operator+(&local_288," * ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1a8);
          plVar8 = (long *)std::__cxx11::string::append((char *)&local_288);
          local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
          psVar9 = (size_type *)(plVar8 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar8 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar9) {
            local_2b8.field_2._M_allocated_capacity = *psVar9;
            local_2b8.field_2._8_8_ = plVar8[3];
          }
          else {
            local_2b8.field_2._M_allocated_capacity = *psVar9;
            local_2b8._M_dataplus._M_p = (pointer)*plVar8;
          }
          local_2b8._M_string_length = plVar8[1];
          *plVar8 = (long)psVar9;
          plVar8[1] = 0;
          *(undefined1 *)(plVar8 + 2) = 0;
          std::__cxx11::string::_M_append((char *)&local_268,(ulong)local_2b8._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
            operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_288._M_dataplus._M_p != &local_288.field_2) {
            operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
          }
        }
        if ((cmListFileContext *)local_1a8._0_8_ != &local_198) {
          operator_delete((void *)local_1a8._0_8_,(ulong)(local_198.Name._M_dataplus._M_p + 1));
        }
      }
      if (local_260 != 0) {
        this = cmMakefile::GetCMakeInstance(local_228);
        local_1e8[0] = local_1d8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1e8,"Used includes for target ","");
        plVar8 = (long *)std::__cxx11::string::_M_append
                                   ((char *)local_1e8,(ulong)(local_298->Name)._M_dataplus._M_p);
        local_208 = &local_1f8;
        plVar10 = plVar8 + 2;
        if ((long *)*plVar8 == plVar10) {
          local_1f8 = *plVar10;
          lStack_1f0 = plVar8[3];
        }
        else {
          local_1f8 = *plVar10;
          local_208 = (long *)*plVar8;
        }
        local_200 = plVar8[1];
        *plVar8 = (long)plVar10;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_208);
        local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
        psVar9 = (size_type *)(plVar8 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar9) {
          local_288.field_2._M_allocated_capacity = *psVar9;
          local_288.field_2._8_8_ = plVar8[3];
        }
        else {
          local_288.field_2._M_allocated_capacity = *psVar9;
          local_288._M_dataplus._M_p = (pointer)*plVar8;
        }
        local_288._M_string_length = plVar8[1];
        *plVar8 = (long)psVar9;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        plVar8 = (long *)std::__cxx11::string::_M_append((char *)&local_288,(ulong)local_268);
        local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
        psVar9 = (size_type *)(plVar8 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar9) {
          local_2b8.field_2._M_allocated_capacity = *psVar9;
          local_2b8.field_2._8_8_ = plVar8[3];
        }
        else {
          local_2b8.field_2._M_allocated_capacity = *psVar9;
          local_2b8._M_dataplus._M_p = (pointer)*plVar8;
        }
        local_2b8._M_string_length = plVar8[1];
        *plVar8 = (long)psVar9;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        __x = ((*local_220)->ge).x_;
        std::vector<cmListFileContext,_std::allocator<cmListFileContext>_>::vector
                  ((vector<cmListFileContext,_std::allocator<cmListFileContext>_> *)local_1a8,
                   (vector<cmListFileContext,_std::allocator<cmListFileContext>_> *)__x);
        local_198.Name.field_2._8_8_ = (__x->Backtrace).Snapshot.Position.Position;
        local_198.Name._M_string_length = (size_type)(__x->Backtrace).Snapshot.State;
        local_198.Name.field_2._M_allocated_capacity =
             (size_type)(__x->Backtrace).Snapshot.Position.Tree;
        cmake::IssueMessage(this,LOG,&local_2b8,(cmListFileBacktrace *)local_1a8);
        std::vector<cmListFileContext,_std::allocator<cmListFileContext>_>::~vector
                  ((vector<cmListFileContext,_std::allocator<cmListFileContext>_> *)local_1a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
          operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_288._M_dataplus._M_p != &local_288.field_2) {
          operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
        }
        if (local_208 != &local_1f8) {
          operator_delete(local_208,local_1f8 + 1);
        }
        if (local_1e8[0] != local_1d8) {
          operator_delete(local_1e8[0],local_1d8[0] + 1);
        }
      }
      if (local_268 != &local_258) {
        operator_delete(local_268,CONCAT71(uStack_257,local_258) + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_248);
      local_220 = local_220 + 1;
    } while (bVar13 && local_220 != local_1c8);
  }
  return;
}

Assistant:

static void processIncludeDirectories(cmTarget const* tgt,
      const std::vector<cmTargetInternals::TargetPropertyEntry*> &entries,
      std::vector<std::string> &includes,
      UNORDERED_SET<std::string> &uniqueIncludes,
      cmGeneratorExpressionDAGChecker *dagChecker,
      const std::string& config, bool debugIncludes,
      const std::string& language)
{
  cmMakefile *mf = tgt->GetMakefile();

  for (std::vector<cmTargetInternals::TargetPropertyEntry*>::const_iterator
      it = entries.begin(), end = entries.end(); it != end; ++it)
    {
    cmLinkImplItem const& item = (*it)->LinkImplItem;
    std::string const& targetName = item;
    bool const fromImported = item.Target && item.Target->IsImported();
    bool const checkCMP0027 = item.FromGenex;
    std::vector<std::string> entryIncludes;
    cmSystemTools::ExpandListArgument((*it)->ge->Evaluate(mf,
                                              config,
                                              false,
                                              tgt,
                                              dagChecker, language),
                                    entryIncludes);

    std::string usedIncludes;
    for(std::vector<std::string>::iterator
          li = entryIncludes.begin(); li != entryIncludes.end(); ++li)
      {
      if (fromImported
          && !cmSystemTools::FileExists(li->c_str()))
        {
        std::ostringstream e;
        cmake::MessageType messageType = cmake::FATAL_ERROR;
        if (checkCMP0027)
          {
          switch(tgt->GetPolicyStatusCMP0027())
            {
            case cmPolicies::WARN:
              e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0027) << "\n";
            case cmPolicies::OLD:
              messageType = cmake::AUTHOR_WARNING;
              break;
            case cmPolicies::REQUIRED_ALWAYS:
            case cmPolicies::REQUIRED_IF_USED:
            case cmPolicies::NEW:
              break;
            }
          }
        e << "Imported target \"" << targetName << "\" includes "
             "non-existent path\n  \"" << *li << "\"\nin its "
             "INTERFACE_INCLUDE_DIRECTORIES. Possible reasons include:\n"
             "* The path was deleted, renamed, or moved to another "
             "location.\n"
             "* An install or uninstall procedure did not complete "
             "successfully.\n"
             "* The installation package was faulty and references files it "
             "does not provide.\n";
        tgt->GetMakefile()->IssueMessage(messageType, e.str());
        return;
        }

      if (!cmSystemTools::FileIsFullPath(li->c_str()))
        {
        std::ostringstream e;
        bool noMessage = false;
        cmake::MessageType messageType = cmake::FATAL_ERROR;
        if (!targetName.empty())
          {
          e << "Target \"" << targetName << "\" contains relative "
            "path in its INTERFACE_INCLUDE_DIRECTORIES:\n"
            "  \"" << *li << "\"";
          }
        else
          {
          switch(tgt->GetPolicyStatusCMP0021())
            {
            case cmPolicies::WARN:
              {
              e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0021) << "\n";
              messageType = cmake::AUTHOR_WARNING;
              }
              break;
            case cmPolicies::OLD:
              noMessage = true;
            case cmPolicies::REQUIRED_IF_USED:
            case cmPolicies::REQUIRED_ALWAYS:
            case cmPolicies::NEW:
              // Issue the fatal message.
              break;
            }
          e << "Found relative path while evaluating include directories of "
          "\"" << tgt->GetName() << "\":\n  \"" << *li << "\"\n";
          }
        if (!noMessage)
          {
          tgt->GetMakefile()->IssueMessage(messageType, e.str());
          if (messageType == cmake::FATAL_ERROR)
            {
            return;
            }
          }
        }

      if (!cmSystemTools::IsOff(li->c_str()))
        {
        cmSystemTools::ConvertToUnixSlashes(*li);
        }
      std::string inc = *li;

      if(uniqueIncludes.insert(inc).second)
        {
        includes.push_back(inc);
        if (debugIncludes)
          {
          usedIncludes += " * " + inc + "\n";
          }
        }
      }
    if (!usedIncludes.empty())
      {
      mf->GetCMakeInstance()->IssueMessage(cmake::LOG,
                            std::string("Used includes for target ")
                            + tgt->GetName() + ":\n"
                            + usedIncludes, (*it)->ge->GetBacktrace());
      }
    }
}